

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O2

int equal_agency(agency_t *a,agency_t *b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = strcmp(a->id,b->id);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->name,b->name);
    if (iVar1 == 0) {
      iVar1 = strcmp(a->url,b->url);
      if (iVar1 == 0) {
        iVar1 = strcmp(a->timezone,b->timezone);
        uVar2 = uVar3;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->lang,b->lang);
          if (iVar1 == 0) {
            iVar1 = strcmp(a->phone,b->phone);
            if (iVar1 == 0) {
              iVar1 = strcmp(a->fare_url,b->fare_url);
              if (iVar1 == 0) {
                iVar1 = strcmp(a->email,b->email);
                uVar2 = (uint)(iVar1 == 0);
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int equal_agency(const agency_t *a, const agency_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->name, b->name) &&
             !strcmp(a->url, b->url) &&
             !strcmp(a->timezone, b->timezone) &&
             !strcmp(a->lang, b->lang) &&
             !strcmp(a->phone, b->phone) &&
             !strcmp(a->fare_url, b->fare_url) &&
             !strcmp(a->email, b->email));
}